

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

FederateState * __thiscall
helics::CommonCore::getHandleFederateCore(CommonCore *this,InterfaceHandle handle)

{
  bool bVar1;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *this_00;
  FedInfo *pFVar2;
  undefined4 in_ESI;
  long in_RDI;
  type local_fed_id;
  size_t in_stack_ffffffffffffffc8;
  LocalFederateId local_1c [3];
  undefined4 in_stack_fffffffffffffff0;
  ordered_guarded<helics::HandleManager,_std::shared_mutex> *in_stack_fffffffffffffff8;
  FederateState *pFVar3;
  
  local_1c[0].fid =
       (BaseType)
       gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
       read<helics::CommonCore::getHandleFederateCore(helics::InterfaceHandle)::__0>
                 (in_stack_fffffffffffffff8,
                  (anon_class_4_1_58265f66 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  bVar1 = LocalFederateId::isValid(local_1c);
  if (bVar1) {
    this_00 = (DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
               *)(in_RDI + 0x470);
    LocalFederateId::baseValue(local_1c);
    pFVar2 = gmlc::containers::
             DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
             ::operator[](this_00,in_stack_ffffffffffffffc8);
    pFVar3 = pFVar2->fed;
  }
  else {
    pFVar3 = (FederateState *)0x0;
  }
  return pFVar3;
}

Assistant:

FederateState* CommonCore::getHandleFederateCore(InterfaceHandle handle)
{
    auto local_fed_id = handles.read([handle](auto& hand) { return hand.getLocalFedID(handle); });
    if (local_fed_id.isValid()) {
        return loopFederates[local_fed_id.baseValue()].fed;
    }

    return nullptr;
}